

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrWasm<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint32 byteLength_00;
  int iVar5;
  undefined4 *puVar6;
  uint64 index_00;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar7;
  undefined4 extraout_var;
  BYTE *buffer;
  uint32 byteLength;
  ArrayBufferBase *arr;
  uint64 index;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  long lVar8;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x233d,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar1 = playout->Offset;
  uVar4 = GetRegRawInt<unsigned_short>(this,playout->SlotIndex);
  index_00 = (ulong)uVar1 + (ulong)uVar4;
  this_00 = GetWebAssemblyMemory(this);
  pAVar7 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength_00 =
       (*(pAVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  iVar5 = (*(pAVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  switch(playout->ViewType) {
  case TYPE_INT8:
    WasmArrayBoundsCheck<char>(this,index_00,byteLength_00);
    SetRegRaw<int>(this,(uint)playout->Value,(int)*(char *)(lVar8 + index_00));
    break;
  case TYPE_UINT8:
    WasmArrayBoundsCheck<unsigned_char>(this,index_00,byteLength_00);
    SetRegRaw<int>(this,(uint)playout->Value,(uint)*(byte *)(lVar8 + index_00));
    break;
  case TYPE_INT16:
    WasmArrayBoundsCheck<short>(this,index_00,byteLength_00);
    SetRegRaw<int>(this,(uint)playout->Value,(int)*(short *)(lVar8 + index_00));
    break;
  case TYPE_UINT16:
    WasmArrayBoundsCheck<unsigned_short>(this,index_00,byteLength_00);
    SetRegRaw<int>(this,(uint)playout->Value,(uint)*(ushort *)(lVar8 + index_00));
    break;
  case TYPE_INT32:
    WasmArrayBoundsCheck<int>(this,index_00,byteLength_00);
    SetRegRaw<int>(this,(uint)playout->Value,*(int *)(lVar8 + index_00));
    break;
  case TYPE_UINT32:
    WasmArrayBoundsCheck<unsigned_int>(this,index_00,byteLength_00);
    SetRegRaw<int>(this,(uint)playout->Value,*(int *)(lVar8 + index_00));
    break;
  case TYPE_FLOAT32:
    WasmArrayBoundsCheck<float>(this,index_00,byteLength_00);
    SetRegRaw<float>(this,(uint)playout->Value,*(float *)(lVar8 + index_00));
    break;
  case TYPE_FLOAT64:
    WasmArrayBoundsCheck<double>(this,index_00,byteLength_00);
    SetRegRaw<double>(this,(uint)playout->Value,*(double *)(lVar8 + index_00));
    break;
  case TYPE_INT64:
    WasmArrayBoundsCheck<long>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,*(int64 *)(lVar8 + index_00));
    break;
  case TYPE_INT8_TO_INT64:
    WasmArrayBoundsCheck<char>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,(long)*(char *)(lVar8 + index_00));
    break;
  case TYPE_UINT8_TO_INT64:
    WasmArrayBoundsCheck<unsigned_char>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,(ulong)*(byte *)(lVar8 + index_00));
    break;
  case TYPE_INT16_TO_INT64:
    WasmArrayBoundsCheck<short>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,(long)*(short *)(lVar8 + index_00));
    break;
  case TYPE_UINT16_TO_INT64:
    WasmArrayBoundsCheck<unsigned_short>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,(ulong)*(ushort *)(lVar8 + index_00));
    break;
  case TYPE_INT32_TO_INT64:
    WasmArrayBoundsCheck<int>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,(long)*(int *)(lVar8 + index_00));
    break;
  case TYPE_UINT32_TO_INT64:
    WasmArrayBoundsCheck<unsigned_int>(this,index_00,byteLength_00);
    SetRegRaw<long>(this,(uint)playout->Value,(ulong)*(uint *)(lVar8 + index_00));
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x234b,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            SetRegRaw<RegType>(playout->Value, (RegType)*(MemType*)(buffer + index)); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }